

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlstring.c
# Opt level: O2

xmlChar * xmlStrncat(xmlChar *cur,xmlChar *add,int len)

{
  uint uVar1;
  xmlChar *pxVar2;
  ulong uVar3;
  ulong __n;
  
  if (len != 0 && add != (xmlChar *)0x0) {
    if (-1 < len) {
      if (cur == (xmlChar *)0x0) {
        pxVar2 = xmlStrndup(add,len);
        return pxVar2;
      }
      uVar1 = xmlStrlen(cur);
      if (uVar1 <= (len ^ 0x7fffffffU) && -1 < (int)uVar1) {
        uVar3 = (ulong)uVar1;
        __n = (ulong)(uint)len;
        pxVar2 = (xmlChar *)(*xmlRealloc)(cur,__n + uVar3 + 1);
        if (pxVar2 != (xmlChar *)0x0) {
          memcpy(pxVar2 + uVar3,add,__n);
          pxVar2[__n + uVar3] = '\0';
          return pxVar2;
        }
        (*xmlFree)(cur);
      }
    }
    cur = (xmlChar *)0x0;
  }
  return cur;
}

Assistant:

xmlChar *
xmlStrncat(xmlChar *cur, const xmlChar *add, int len) {
    int size;
    xmlChar *ret;

    if ((add == NULL) || (len == 0))
        return(cur);
    if (len < 0)
	return(NULL);
    if (cur == NULL)
        return(xmlStrndup(add, len));

    size = xmlStrlen(cur);
    if ((size < 0) || (size > INT_MAX - len))
        return(NULL);
    ret = (xmlChar *) xmlRealloc(cur, (size_t) size + len + 1);
    if (ret == NULL) {
        xmlFree(cur);
        return(NULL);
    }
    memcpy(&ret[size], add, len);
    ret[size + len] = 0;
    return(ret);
}